

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::num_writer>
          *f)

{
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> __first;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> __first_00;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> __first_01;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> __first_02;
  uint uVar1;
  alignment aVar2;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *ptVar3;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::num_writer>
  *in_RDX;
  align_spec *in_RSI;
  size_t left_padding;
  size_t padding;
  char_type fill;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it;
  size_t num_code_points;
  size_t size;
  uint width;
  size_t in_stack_fffffffffffffe78;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
  *in_stack_fffffffffffffe80;
  ulong local_160;
  char *local_130;
  size_t local_128;
  size_t local_120;
  value_type_conflict in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffee9;
  unsigned_long in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  size_t local_e0;
  value_type_conflict in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff29;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::num_writer>
  *in_stack_ffffffffffffff30;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::num_writer>
  *this_00;
  char *local_b0;
  size_t local_a8;
  size_t local_a0;
  value_type_conflict local_98;
  char *local_68;
  size_t local_60;
  size_t local_58;
  value_type_conflict local_50;
  
  uVar1 = align_spec::width(in_RSI);
  local_160 = basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
              ::
              padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::num_writer>
              ::size(in_RDX);
  if (uVar1 != 0) {
    local_160 = basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
                ::
                padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::num_writer>
                ::width(in_RDX);
  }
  if (local_160 < uVar1) {
    ptVar3 = basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
             ::reserve(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    align_spec::fill(in_RSI);
    aVar2 = align_spec::align(in_RSI);
    if (aVar2 == ALIGN_RIGHT) {
      __first.super_truncating_iterator_base<char_*>.limit_ = in_stack_ffffffffffffff08;
      __first.super_truncating_iterator_base<char_*>.out_ = (char *)in_stack_ffffffffffffff00;
      __first.super_truncating_iterator_base<char_*>.count_ = (size_t)in_stack_ffffffffffffff10;
      __first._24_8_ = in_stack_ffffffffffffff18;
      std::
      fill_n<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,unsigned_long,char>
                (__first,in_stack_fffffffffffffef0,
                 (char *)CONCAT71(in_stack_fffffffffffffee9,in_stack_fffffffffffffee8));
      (ptVar3->super_truncating_iterator_base<char_*>).out_ = local_68;
      (ptVar3->super_truncating_iterator_base<char_*>).limit_ = local_60;
      (ptVar3->super_truncating_iterator_base<char_*>).count_ = local_58;
      ptVar3->blackhole_ = local_50;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
      ::operator()(in_stack_ffffffffffffff30,
                   (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)
                   CONCAT71(in_stack_ffffffffffffff29,in_stack_ffffffffffffff28));
    }
    else {
      aVar2 = align_spec::align(in_RSI);
      if (aVar2 == ALIGN_CENTER) {
        this_00 = (padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::num_writer>
                   *)(ptVar3->super_truncating_iterator_base<char_*>).out_;
        __first_00.super_truncating_iterator_base<char_*>.limit_ = in_stack_ffffffffffffff08;
        __first_00.super_truncating_iterator_base<char_*>.out_ = (char *)in_stack_ffffffffffffff00;
        __first_00.super_truncating_iterator_base<char_*>.count_ = (size_t)in_stack_ffffffffffffff10
        ;
        __first_00._24_8_ = in_stack_ffffffffffffff18;
        std::
        fill_n<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,unsigned_long,char>
                  (__first_00,in_stack_fffffffffffffef0,
                   (char *)CONCAT71(in_stack_fffffffffffffee9,in_stack_fffffffffffffee8));
        (ptVar3->super_truncating_iterator_base<char_*>).out_ = local_b0;
        (ptVar3->super_truncating_iterator_base<char_*>).limit_ = local_a8;
        (ptVar3->super_truncating_iterator_base<char_*>).count_ = local_a0;
        ptVar3->blackhole_ = local_98;
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
        ::operator()(this_00,(truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)
                             CONCAT71(in_stack_ffffffffffffff29,in_stack_ffffffffffffff28));
        __first_01.super_truncating_iterator_base<char_*>.count_ = (size_t)in_stack_ffffffffffffff10
        ;
        __first_01.super_truncating_iterator_base<char_*>._0_16_ =
             *(undefined1 (*) [16])&(ptVar3->super_truncating_iterator_base<char_*>).count_;
        __first_01._24_8_ = in_stack_ffffffffffffff18;
        std::
        fill_n<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,unsigned_long,char>
                  (__first_01,(unsigned_long)(ptVar3->super_truncating_iterator_base<char_*>).out_,
                   (char *)CONCAT71(in_stack_fffffffffffffee9,in_stack_fffffffffffffee8));
        (ptVar3->super_truncating_iterator_base<char_*>).out_ = in_stack_ffffffffffffff10;
        (ptVar3->super_truncating_iterator_base<char_*>).limit_ = in_stack_ffffffffffffff18;
        (ptVar3->super_truncating_iterator_base<char_*>).count_ = local_e0;
        ptVar3->blackhole_ = in_stack_ffffffffffffff28;
      }
      else {
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
        ::operator()(in_stack_ffffffffffffff30,
                     (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)
                     CONCAT71(in_stack_ffffffffffffff29,in_stack_ffffffffffffff28));
        __first_02.super_truncating_iterator_base<char_*>.limit_ = in_stack_ffffffffffffff08;
        __first_02.super_truncating_iterator_base<char_*>.out_ = (char *)in_stack_ffffffffffffff00;
        __first_02.super_truncating_iterator_base<char_*>.count_ = (size_t)in_stack_ffffffffffffff10
        ;
        __first_02._24_8_ = in_stack_ffffffffffffff18;
        std::
        fill_n<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,unsigned_long,char>
                  (__first_02,in_stack_fffffffffffffef0,
                   (char *)CONCAT71(in_stack_fffffffffffffee9,in_stack_fffffffffffffee8));
        (ptVar3->super_truncating_iterator_base<char_*>).out_ = local_130;
        (ptVar3->super_truncating_iterator_base<char_*>).limit_ = local_128;
        (ptVar3->super_truncating_iterator_base<char_*>).count_ = local_120;
        ptVar3->blackhole_ = in_stack_fffffffffffffee8;
      }
    }
  }
  else {
    basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
    ::reserve(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer>
    ::operator()(in_stack_ffffffffffffff30,
                 (truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *)
                 CONCAT71(in_stack_ffffffffffffff29,in_stack_ffffffffffffff28));
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }